

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FundamentalParameterData.cpp
# Opt level: O1

void __thiscall
KDIS::DATA_TYPE::FundamentalParameterData::Encode
          (FundamentalParameterData *this,KDataStream *stream)

{
  KDataStream::Write<float>(stream,(float)this->m_f32Freq);
  KDataStream::Write<float>(stream,(float)this->m_f32FreqRange);
  KDataStream::Write<float>(stream,(float)this->m_f32EffectiveRadiatedPower);
  KDataStream::Write<float>(stream,(float)this->m_f32PulseRepetitionFreq);
  KDataStream::Write<float>(stream,(float)this->m_f32PulseWidth);
  KDataStream::Write<float>(stream,(float)this->m_f32BeamAzimuthCenter);
  KDataStream::Write<float>(stream,(float)this->m_f32BeamAzimuthSweep);
  KDataStream::Write<float>(stream,(float)this->m_f32BeamElevationCenter);
  KDataStream::Write<float>(stream,(float)this->m_f32BeamElevationSweep);
  KDataStream::Write<float>(stream,(float)this->m_f32BeamSweepSync);
  return;
}

Assistant:

void FundamentalParameterData::Encode( KDataStream & stream ) const
{
    stream << m_f32Freq
           << m_f32FreqRange
           << m_f32EffectiveRadiatedPower
           << m_f32PulseRepetitionFreq
           << m_f32PulseWidth
           << m_f32BeamAzimuthCenter
           << m_f32BeamAzimuthSweep
           << m_f32BeamElevationCenter
           << m_f32BeamElevationSweep
           << m_f32BeamSweepSync;
}